

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor_test.cpp
# Opt level: O0

void __thiscall preprocessor_test_tuple_Test::TestBody(preprocessor_test_tuple_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int *in_stack_ffffffffffffff30;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  char *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  AssertionResult *this_01;
  AssertHelper local_90;
  Message local_88;
  undefined4 local_80;
  undefined4 local_7c;
  AssertionResult local_78;
  AssertHelper local_68;
  Message local_60;
  undefined4 local_58;
  undefined4 local_54;
  AssertionResult local_50;
  AssertHelper local_40;
  Message local_38 [3];
  undefined4 local_20;
  undefined4 local_1c;
  AssertionResult local_18;
  
  local_1c = 0;
  local_20 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             (int *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message(local_38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x110e95);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0xd2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message((Message *)0x110ef2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x110f47);
  local_54 = 1;
  local_58 = 1;
  this_01 = &local_50;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (&this_01->success_,in_stack_ffffffffffffff40,
             (int *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    in_stack_ffffffffffffff40 =
         testing::AssertionResult::failure_message((AssertionResult *)0x110fec);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0xd4,in_stack_ffffffffffffff40);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message((Message *)0x11103a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x111089);
  local_7c = 0;
  local_80 = 1;
  this_00 = &local_78;
  testing::internal::CmpHelperNE<int,int>
            (&this_01->success_,in_stack_ffffffffffffff40,
             (int *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x111120);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0xd6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message((Message *)0x11116c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1111b8);
  return;
}

Assistant:

TEST_F(preprocessor_test, tuple)
{
	EXPECT_EQ((int)0, PREPROCESSOR_TUPLE_EXPAND(PREPROCESSOR_TUPLE_MAKE((int)0)));

	PREPROCESSOR_TUPLE_EXPAND_MACRO(EXPECT_EQ, PREPROCESSOR_TUPLE_PREPEND((int)1, PREPROCESSOR_TUPLE_MAKE((int)1)));

	PREPROCESSOR_TUPLE_EXPAND_MACRO(EXPECT_NE, PREPROCESSOR_TUPLE_APPEND((int)1, PREPROCESSOR_TUPLE_MAKE((int)0)));
}